

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  TValue *pTVar1;
  ulong uVar2;
  char *name;
  char *local_18;
  
  local_18 = (char *)0x0;
  if (ar == (lua_Debug *)0x0) {
    if ((*(int *)((long)L->top + -4) == -9) &&
       (uVar2 = (ulong)L->top[-1].u32.lo, *(char *)(uVar2 + 6) == '\0')) {
      local_18 = debug_varname((GCproto *)((ulong)*(uint *)(uVar2 + 0x10) - 0x40),0,n - 1);
    }
  }
  else {
    pTVar1 = debug_localname(L,ar,&local_18,n);
    if (local_18 != (char *)0x0) {
      *L->top = *pTVar1;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar1 + 1) {
        lj_state_growstack(L,1);
      }
    }
  }
  return local_18;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  if (ar) {
    TValue *o = debug_localname(L, ar, &name, (BCReg)n);
    if (name) {
      copyTV(L, L->top, o);
      incr_top(L);
    }
  } else if (tvisfunc(L->top-1) && isluafunc(funcV(L->top-1))) {
    name = debug_varname(funcproto(funcV(L->top-1)), 0, (BCReg)n-1);
  }
  return name;
}